

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

void __thiscall FIX::Session::nextLogon(Session *this,Message *logon,UtcTimeStamp *now)

{
  Header *this_00;
  SessionState *this_01;
  bool bVar1;
  int iVar2;
  uint64_t uVar3;
  SEQNUM SVar4;
  ostream *poVar5;
  FieldBase *this_02;
  IntTConvertor<unsigned_long> *pIVar6;
  long *plVar7;
  undefined8 *puVar8;
  undefined8 uVar9;
  size_type *psVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  unsigned_long value;
  unsigned_long value_00;
  unsigned_long value_01;
  uchar *in_R8;
  size_t in_R9;
  size_type __dnew_4;
  stringstream stream;
  NextExpectedMsgSeqNum nextExpectedMsgSeqNum;
  ResetSeqNumFlag resetSeqNumFlag;
  string local_2f0;
  pthread_mutex_t *local_2d0;
  string local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  string local_288;
  undefined1 local_268 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_258 [7];
  ios_base local_1e8 [264];
  FieldBase local_e0;
  FieldBase local_88;
  
  this_00 = &logon->m_header;
  FieldMap::getFieldRef(&this_00->super_FieldMap,0x31);
  FieldMap::getFieldRef(&this_00->super_FieldMap,0x38);
  if (this->m_refreshOnLogon == true) {
    SessionState::refresh(&this->m_state);
  }
  if ((this->m_state).m_enabled == false) {
    local_268._0_8_ = local_258;
    local_88._vptr_FieldBase = (_func_int **)0x20;
    local_268._0_8_ = std::__cxx11::string::_M_create((ulong *)local_268,(ulong)&local_88);
    local_258[0]._M_allocated_capacity = local_88._vptr_FieldBase;
    *(char *)(local_268._0_8_ + 0x10) = 'n';
    *(char *)(local_268._0_8_ + 0x11) = 'a';
    *(char *)(local_268._0_8_ + 0x12) = 'b';
    *(char *)(local_268._0_8_ + 0x13) = 'l';
    *(char *)(local_268._0_8_ + 0x14) = 'e';
    *(char *)(local_268._0_8_ + 0x15) = 'd';
    *(char *)(local_268._0_8_ + 0x16) = ' ';
    *(char *)(local_268._0_8_ + 0x17) = 'f';
    *(char *)(local_268._0_8_ + 0x18) = 'o';
    *(char *)(local_268._0_8_ + 0x19) = 'r';
    *(char *)(local_268._0_8_ + 0x1a) = ' ';
    *(char *)(local_268._0_8_ + 0x1b) = 'l';
    *(char *)(local_268._0_8_ + 0x1c) = 'o';
    *(char *)(local_268._0_8_ + 0x1d) = 'g';
    *(char *)(local_268._0_8_ + 0x1e) = 'o';
    *(char *)(local_268._0_8_ + 0x1f) = 'n';
    *(undefined8 *)local_268._0_8_ = 0x206e6f6973736553;
    *(char *)(local_268._0_8_ + 8) = 'i';
    *(char *)(local_268._0_8_ + 9) = 's';
    *(char *)(local_268._0_8_ + 10) = ' ';
    *(char *)(local_268._0_8_ + 0xb) = 'n';
    *(char *)(local_268._0_8_ + 0xc) = 'o';
    *(char *)(local_268._0_8_ + 0xd) = 't';
    *(char *)(local_268._0_8_ + 0xe) = ' ';
    *(char *)(local_268._0_8_ + 0xf) = 'e';
    local_268._8_8_ = local_88._vptr_FieldBase;
    *(char *)(local_268._0_8_ + (long)local_88._vptr_FieldBase) = '\0';
    SessionState::onEvent(&this->m_state,(string *)local_268);
LAB_001a4977:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._0_8_ != local_258) {
      operator_delete((void *)local_268._0_8_,local_258[0]._M_allocated_capacity + 1);
    }
    disconnect(this);
    return;
  }
  bVar1 = TimeRange::isInRange(&this->m_logonTime,now);
  if (!bVar1) {
    local_268._0_8_ = local_258;
    local_88._vptr_FieldBase = (_func_int **)0x2a;
    local_268._0_8_ = std::__cxx11::string::_M_create((ulong *)local_268,(ulong)&local_88);
    local_258[0]._M_allocated_capacity = local_88._vptr_FieldBase;
    *(char *)(local_268._0_8_ + 0x1a) = 'v';
    *(char *)(local_268._0_8_ + 0x1b) = 'a';
    *(char *)(local_268._0_8_ + 0x1c) = 'l';
    *(char *)(local_268._0_8_ + 0x1d) = 'i';
    *(char *)(local_268._0_8_ + 0x1e) = 'd';
    *(char *)(local_268._0_8_ + 0x1f) = ' ';
    *(char *)(local_268._0_8_ + 0x20) = 'l';
    *(char *)(local_268._0_8_ + 0x21) = 'o';
    *(char *)(local_268._0_8_ + 0x22) = 'g';
    *(char *)(local_268._0_8_ + 0x23) = 'o';
    *(char *)(local_268._0_8_ + 0x24) = 'n';
    *(char *)(local_268._0_8_ + 0x25) = ' ';
    *(char *)(local_268._0_8_ + 0x26) = 't';
    *(char *)(local_268._0_8_ + 0x27) = 'i';
    *(char *)(local_268._0_8_ + 0x28) = 'm';
    *(char *)(local_268._0_8_ + 0x29) = 'e';
    *(char *)(local_268._0_8_ + 0x10) = 'u';
    *(char *)(local_268._0_8_ + 0x11) = 't';
    *(char *)(local_268._0_8_ + 0x12) = 's';
    *(char *)(local_268._0_8_ + 0x13) = 'i';
    *(char *)(local_268._0_8_ + 0x14) = 'd';
    *(char *)(local_268._0_8_ + 0x15) = 'e';
    *(char *)(local_268._0_8_ + 0x16) = ' ';
    *(char *)(local_268._0_8_ + 0x17) = 'o';
    *(char *)(local_268._0_8_ + 0x18) = 'f';
    *(char *)(local_268._0_8_ + 0x19) = ' ';
    *(char *)(local_268._0_8_ + 0x1a) = 'v';
    *(char *)(local_268._0_8_ + 0x1b) = 'a';
    *(char *)(local_268._0_8_ + 0x1c) = 'l';
    *(char *)(local_268._0_8_ + 0x1d) = 'i';
    *(char *)(local_268._0_8_ + 0x1e) = 'd';
    *(char *)(local_268._0_8_ + 0x1f) = ' ';
    *(undefined8 *)local_268._0_8_ = 0x6465766965636552;
    *(char *)(local_268._0_8_ + 8) = ' ';
    *(char *)(local_268._0_8_ + 9) = 'l';
    *(char *)(local_268._0_8_ + 10) = 'o';
    *(char *)(local_268._0_8_ + 0xb) = 'g';
    *(char *)(local_268._0_8_ + 0xc) = 'o';
    *(char *)(local_268._0_8_ + 0xd) = 'n';
    *(char *)(local_268._0_8_ + 0xe) = ' ';
    *(char *)(local_268._0_8_ + 0xf) = 'o';
    local_268._8_8_ = local_88._vptr_FieldBase;
    *(char *)(local_268._0_8_ + (long)local_88._vptr_FieldBase) = '\0';
    SessionState::onEvent(&this->m_state,(string *)local_268);
    goto LAB_001a4977;
  }
  BoolField::BoolField((BoolField *)&local_88,0x8d,false);
  local_88._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001f6ed0;
  FieldMap::getFieldIfSet(&logon->super_FieldMap,&local_88);
  bVar1 = BoolField::getValue((BoolField *)&local_88);
  this_01 = &this->m_state;
  (this->m_state).m_receivedReset = bVar1;
  if (bVar1) {
    local_e0._vptr_FieldBase = (_func_int **)0x40;
    local_268._0_8_ = local_258;
    local_268._0_8_ = std::__cxx11::string::_M_create((ulong *)local_268,(ulong)&local_e0);
    local_258[0]._M_allocated_capacity = local_e0._vptr_FieldBase;
    *(char *)(local_268._0_8_ + 0x30) = 'n';
    *(char *)(local_268._0_8_ + 0x31) = 'c';
    *(char *)(local_268._0_8_ + 0x32) = 'e';
    *(char *)(local_268._0_8_ + 0x33) = ' ';
    *(char *)(local_268._0_8_ + 0x34) = 'n';
    *(char *)(local_268._0_8_ + 0x35) = 'u';
    *(char *)(local_268._0_8_ + 0x36) = 'm';
    *(char *)(local_268._0_8_ + 0x37) = 'b';
    *(char *)(local_268._0_8_ + 0x38) = 'e';
    *(char *)(local_268._0_8_ + 0x39) = 'r';
    *(char *)(local_268._0_8_ + 0x3a) = 's';
    *(char *)(local_268._0_8_ + 0x3b) = ' ';
    *(char *)(local_268._0_8_ + 0x3c) = 't';
    *(char *)(local_268._0_8_ + 0x3d) = 'o';
    *(char *)(local_268._0_8_ + 0x3e) = ' ';
    *(char *)(local_268._0_8_ + 0x3f) = '1';
    *(char *)(local_268._0_8_ + 0x20) = ',';
    *(char *)(local_268._0_8_ + 0x21) = ' ';
    *(char *)(local_268._0_8_ + 0x22) = 'r';
    *(char *)(local_268._0_8_ + 0x23) = 'e';
    *(char *)(local_268._0_8_ + 0x24) = 's';
    *(char *)(local_268._0_8_ + 0x25) = 'e';
    *(char *)(local_268._0_8_ + 0x26) = 't';
    *(char *)(local_268._0_8_ + 0x27) = 'i';
    *(char *)(local_268._0_8_ + 0x28) = 'n';
    *(char *)(local_268._0_8_ + 0x29) = 'g';
    *(char *)(local_268._0_8_ + 0x2a) = ' ';
    *(char *)(local_268._0_8_ + 0x2b) = 's';
    *(char *)(local_268._0_8_ + 0x2c) = 'e';
    *(char *)(local_268._0_8_ + 0x2d) = 'q';
    *(char *)(local_268._0_8_ + 0x2e) = 'u';
    *(char *)(local_268._0_8_ + 0x2f) = 'e';
    *(char *)(local_268._0_8_ + 0x10) = 'e';
    *(char *)(local_268._0_8_ + 0x11) = 's';
    *(char *)(local_268._0_8_ + 0x12) = 'e';
    *(char *)(local_268._0_8_ + 0x13) = 't';
    *(char *)(local_268._0_8_ + 0x14) = 'S';
    *(char *)(local_268._0_8_ + 0x15) = 'e';
    *(char *)(local_268._0_8_ + 0x16) = 'q';
    *(char *)(local_268._0_8_ + 0x17) = 'N';
    *(char *)(local_268._0_8_ + 0x18) = 'u';
    *(char *)(local_268._0_8_ + 0x19) = 'm';
    *(char *)(local_268._0_8_ + 0x1a) = 'F';
    *(char *)(local_268._0_8_ + 0x1b) = 'l';
    *(char *)(local_268._0_8_ + 0x1c) = 'a';
    *(char *)(local_268._0_8_ + 0x1d) = 'g';
    *(char *)(local_268._0_8_ + 0x1e) = '=';
    *(char *)(local_268._0_8_ + 0x1f) = 'Y';
    *(undefined8 *)local_268._0_8_ = 0x6f63206e6f676f4c;
    *(char *)(local_268._0_8_ + 8) = 'n';
    *(char *)(local_268._0_8_ + 9) = 't';
    *(char *)(local_268._0_8_ + 10) = 'a';
    *(char *)(local_268._0_8_ + 0xb) = 'i';
    *(char *)(local_268._0_8_ + 0xc) = 'n';
    *(char *)(local_268._0_8_ + 0xd) = 's';
    *(char *)(local_268._0_8_ + 0xe) = ' ';
    *(char *)(local_268._0_8_ + 0xf) = 'R';
    local_268._8_8_ = local_e0._vptr_FieldBase;
    *(char *)(local_268._0_8_ + (long)local_e0._vptr_FieldBase) = '\0';
    SessionState::onEvent(this_01,(string *)local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._0_8_ != local_258) {
      operator_delete((void *)local_268._0_8_,local_258[0]._M_allocated_capacity + 1);
    }
    if ((this->m_state).m_sentReset == false) {
      if ((this->m_timestamper).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
        goto LAB_001a5182;
      }
      (*(this->m_timestamper)._M_invoker)
                ((UtcTimeStamp *)local_268,(_Any_data *)&this->m_timestamper);
      SessionState::reset(this_01,(UtcTimeStamp *)local_268);
    }
  }
  bVar1 = (this->m_state).m_initiate;
  if (((bVar1 == true) && (((this->m_state).m_sentLogon & 1U) == 0)) &&
     ((this->m_state).m_receivedReset == false)) {
    local_e0._vptr_FieldBase = (_func_int **)0x2e;
    local_268._0_8_ = local_258;
    local_268._0_8_ = std::__cxx11::string::_M_create((ulong *)local_268,(ulong)&local_e0);
    local_258[0]._M_allocated_capacity = local_e0._vptr_FieldBase;
    *(char *)(local_268._0_8_ + 0x1e) = ' ';
    *(char *)(local_268._0_8_ + 0x1f) = 's';
    *(char *)(local_268._0_8_ + 0x20) = 'e';
    *(char *)(local_268._0_8_ + 0x21) = 'n';
    *(char *)(local_268._0_8_ + 0x22) = 'd';
    *(char *)(local_268._0_8_ + 0x23) = 'i';
    *(char *)(local_268._0_8_ + 0x24) = 'n';
    *(char *)(local_268._0_8_ + 0x25) = 'g';
    *(char *)(local_268._0_8_ + 0x26) = ' ';
    *(char *)(local_268._0_8_ + 0x27) = 'r';
    *(char *)(local_268._0_8_ + 0x28) = 'e';
    *(char *)(local_268._0_8_ + 0x29) = 'q';
    *(char *)(local_268._0_8_ + 0x2a) = 'u';
    *(char *)(local_268._0_8_ + 0x2b) = 'e';
    *(char *)(local_268._0_8_ + 0x2c) = 's';
    *(char *)(local_268._0_8_ + 0x2d) = 't';
    *(char *)(local_268._0_8_ + 0x10) = 'e';
    *(char *)(local_268._0_8_ + 0x11) = 's';
    *(char *)(local_268._0_8_ + 0x12) = 'p';
    *(char *)(local_268._0_8_ + 0x13) = 'o';
    *(char *)(local_268._0_8_ + 0x14) = 'n';
    *(char *)(local_268._0_8_ + 0x15) = 's';
    *(char *)(local_268._0_8_ + 0x16) = 'e';
    *(char *)(local_268._0_8_ + 0x17) = ' ';
    *(char *)(local_268._0_8_ + 0x18) = 'b';
    *(char *)(local_268._0_8_ + 0x19) = 'e';
    *(char *)(local_268._0_8_ + 0x1a) = 'f';
    *(char *)(local_268._0_8_ + 0x1b) = 'o';
    *(char *)(local_268._0_8_ + 0x1c) = 'r';
    *(char *)(local_268._0_8_ + 0x1d) = 'e';
    *(char *)(local_268._0_8_ + 0x1e) = ' ';
    *(char *)(local_268._0_8_ + 0x1f) = 's';
    *(undefined8 *)local_268._0_8_ = 0x6465766965636552;
    *(char *)(local_268._0_8_ + 8) = ' ';
    *(char *)(local_268._0_8_ + 9) = 'l';
    *(char *)(local_268._0_8_ + 10) = 'o';
    *(char *)(local_268._0_8_ + 0xb) = 'g';
    *(char *)(local_268._0_8_ + 0xc) = 'o';
    *(char *)(local_268._0_8_ + 0xd) = 'n';
    *(char *)(local_268._0_8_ + 0xe) = ' ';
    *(char *)(local_268._0_8_ + 0xf) = 'r';
    local_268._8_8_ = local_e0._vptr_FieldBase;
    *(char *)(local_268._0_8_ + (long)local_e0._vptr_FieldBase) = '\0';
    SessionState::onEvent(this_01,(string *)local_268);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._0_8_ != local_258) {
      operator_delete((void *)local_268._0_8_,local_258[0]._M_allocated_capacity + 1);
    }
    disconnect(this);
    goto LAB_001a5031;
  }
  if ((bVar1 == false) && (this->m_resetOnLogon == true)) {
    if ((this->m_timestamper).super__Function_base._M_manager == (_Manager_type)0x0) {
LAB_001a5182:
      uVar9 = std::__throw_bad_function_call();
      FieldBase::~FieldBase((FieldBase *)local_268);
      iVar2 = (this->m_mutex).m_count;
      (this->m_mutex).m_count = iVar2 + -1;
      if (iVar2 < 2) {
        (this->m_mutex).m_threadID = 0;
        pthread_mutex_unlock(local_2d0);
      }
      FieldBase::~FieldBase(&local_e0);
      FieldBase::~FieldBase(&local_88);
      _Unwind_Resume(uVar9);
    }
    (*(this->m_timestamper)._M_invoker)((UtcTimeStamp *)local_268,(_Any_data *)&this->m_timestamper)
    ;
    SessionState::reset(this_01,(UtcTimeStamp *)local_268);
  }
  uVar9 = 0;
  iVar2 = verify(this,(EVP_PKEY_CTX *)logon,(uchar *)0x0,1,in_R8,in_R9);
  if ((char)iVar2 == '\0') goto LAB_001a5031;
  (this->m_state).m_receivedLogon = true;
  UInt64Field::UInt64Field((UInt64Field *)&local_e0,0x315);
  local_e0._vptr_FieldBase = (_func_int **)&PTR__FieldBase_001f6f40;
  bVar1 = FieldMap::getFieldIfSet(&logon->super_FieldMap,&local_e0);
  if (bVar1) {
    uVar3 = UInt64Field::getValue((UInt64Field *)&local_e0);
    SVar4 = SessionState::getNextSenderMsgSeqNum(this_01);
    local_2d0 = (pthread_mutex_t *)
                CONCAT44(local_2d0._4_4_,(int)CONCAT71((int7)((ulong)uVar9 >> 8),1));
    if (uVar3 < SVar4) goto LAB_001a4a44;
    uVar3 = UInt64Field::getValue((UInt64Field *)&local_e0);
    SVar4 = SessionState::getNextSenderMsgSeqNum(this_01);
    if (uVar3 <= SVar4) goto LAB_001a4a3c;
    std::__cxx11::stringstream::stringstream((stringstream *)local_268);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_258[0]._M_local_buf,"NextExpectedMsgSeqNum too high, expecting ",
               0x2a);
    SessionState::getNextSenderMsgSeqNum(this_01);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)local_258);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," but received ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,local_e0.m_string._M_dataplus._M_p,local_e0.m_string._M_string_length);
    std::__cxx11::stringbuf::str();
    SessionState::onEvent(this_01,&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::stringbuf::str();
    generateLogout(this,&local_2f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
      operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
    }
    disconnect(this);
    std::__cxx11::stringstream::~stringstream((stringstream *)local_268);
    std::ios_base::~ios_base(local_1e8);
  }
  else {
LAB_001a4a3c:
    local_2d0 = (pthread_mutex_t *)((ulong)local_2d0 & 0xffffffff00000000);
LAB_001a4a44:
    if (((this->m_state).m_initiate == true) &&
       (((this->m_state).m_receivedReset != true || ((this->m_state).m_sentReset != false)))) {
      local_268._0_8_ = local_258;
      local_2f0._M_dataplus._M_p = (pointer)0x17;
      local_268._0_8_ = std::__cxx11::string::_M_create((ulong *)local_268,(ulong)&local_2f0);
      local_258[0]._M_allocated_capacity = local_2f0._M_dataplus._M_p;
      *(undefined8 *)local_268._0_8_ = 0x6465766965636552;
      *(char *)(local_268._0_8_ + 8) = ' ';
      *(char *)(local_268._0_8_ + 9) = 'l';
      *(char *)(local_268._0_8_ + 10) = 'o';
      *(char *)(local_268._0_8_ + 0xb) = 'g';
      *(char *)(local_268._0_8_ + 0xc) = 'o';
      *(char *)(local_268._0_8_ + 0xd) = 'n';
      *(char *)(local_268._0_8_ + 0xe) = ' ';
      *(char *)(local_268._0_8_ + 0xf) = 'r';
      *(char *)(local_268._0_8_ + 0xf) = 'r';
      *(char *)(local_268._0_8_ + 0x10) = 'e';
      *(char *)(local_268._0_8_ + 0x11) = 's';
      *(char *)(local_268._0_8_ + 0x12) = 'p';
      *(char *)(local_268._0_8_ + 0x13) = 'o';
      *(char *)(local_268._0_8_ + 0x14) = 'n';
      *(char *)(local_268._0_8_ + 0x15) = 's';
      *(char *)(local_268._0_8_ + 0x16) = 'e';
      local_268._8_8_ = local_2f0._M_dataplus._M_p;
      *(char *)(local_268._0_8_ + (long)local_2f0._M_dataplus._M_p) = '\0';
      SessionState::onEvent(this_01,(string *)local_268);
    }
    else {
      FieldMap::getFieldIfSet(&logon->super_FieldMap,(FieldBase *)&(this->m_state).m_heartBtInt);
      local_2f0._M_dataplus._M_p = (pointer)0x16;
      local_268._0_8_ = local_258;
      local_268._0_8_ = std::__cxx11::string::_M_create((ulong *)local_268,(ulong)&local_2f0);
      local_258[0]._M_allocated_capacity = local_2f0._M_dataplus._M_p;
      *(undefined8 *)local_268._0_8_ = 0x6465766965636552;
      *(char *)(local_268._0_8_ + 8) = ' ';
      *(char *)(local_268._0_8_ + 9) = 'l';
      *(char *)(local_268._0_8_ + 10) = 'o';
      *(char *)(local_268._0_8_ + 0xb) = 'g';
      *(char *)(local_268._0_8_ + 0xc) = 'o';
      *(char *)(local_268._0_8_ + 0xd) = 'n';
      *(char *)(local_268._0_8_ + 0xe) = ' ';
      *(char *)(local_268._0_8_ + 0xf) = 'r';
      *(char *)(local_268._0_8_ + 0xe) = ' ';
      *(char *)(local_268._0_8_ + 0xf) = 'r';
      *(char *)(local_268._0_8_ + 0x10) = 'e';
      *(char *)(local_268._0_8_ + 0x11) = 'q';
      *(char *)(local_268._0_8_ + 0x12) = 'u';
      *(char *)(local_268._0_8_ + 0x13) = 'e';
      *(char *)(local_268._0_8_ + 0x14) = 's';
      *(char *)(local_268._0_8_ + 0x15) = 't';
      local_268._8_8_ = local_2f0._M_dataplus._M_p;
      *(char *)(local_268._0_8_ + (long)local_2f0._M_dataplus._M_p) = '\0';
      SessionState::onEvent(this_01,(string *)local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._0_8_ != local_258) {
        operator_delete((void *)local_268._0_8_,local_258[0]._M_allocated_capacity + 1);
      }
      generateLogon(this,logon);
      local_2f0._M_dataplus._M_p = (pointer)0x1b;
      local_268._0_8_ = local_258;
      local_268._0_8_ = std::__cxx11::string::_M_create((ulong *)local_268,(ulong)&local_2f0);
      local_258[0]._M_allocated_capacity = local_2f0._M_dataplus._M_p;
      *(char *)(local_268._0_8_ + 0xb) = 't';
      *(char *)(local_268._0_8_ + 0xc) = 'o';
      *(char *)(local_268._0_8_ + 0xd) = ' ';
      *(char *)(local_268._0_8_ + 0xe) = 'l';
      *(char *)(local_268._0_8_ + 0xf) = 'o';
      *(char *)(local_268._0_8_ + 0x10) = 'g';
      *(char *)(local_268._0_8_ + 0x11) = 'o';
      *(char *)(local_268._0_8_ + 0x12) = 'n';
      *(char *)(local_268._0_8_ + 0x13) = ' ';
      *(char *)(local_268._0_8_ + 0x14) = 'r';
      *(char *)(local_268._0_8_ + 0x15) = 'e';
      *(char *)(local_268._0_8_ + 0x16) = 'q';
      *(char *)(local_268._0_8_ + 0x17) = 'u';
      *(char *)(local_268._0_8_ + 0x18) = 'e';
      *(char *)(local_268._0_8_ + 0x19) = 's';
      *(char *)(local_268._0_8_ + 0x1a) = 't';
      *(undefined8 *)local_268._0_8_ = 0x69646e6f70736552;
      *(char *)(local_268._0_8_ + 8) = 'n';
      *(char *)(local_268._0_8_ + 9) = 'g';
      *(char *)(local_268._0_8_ + 10) = ' ';
      *(char *)(local_268._0_8_ + 0xb) = 't';
      *(char *)(local_268._0_8_ + 0xc) = 'o';
      *(char *)(local_268._0_8_ + 0xd) = ' ';
      *(char *)(local_268._0_8_ + 0xe) = 'l';
      *(char *)(local_268._0_8_ + 0xf) = 'o';
      local_268._8_8_ = local_2f0._M_dataplus._M_p;
      *(char *)(local_268._0_8_ + (long)local_2f0._M_dataplus._M_p) = '\0';
      SessionState::onEvent(this_01,(string *)local_268);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_268._0_8_ != local_258) {
      operator_delete((void *)local_268._0_8_,local_258[0]._M_allocated_capacity + 1);
    }
    (this->m_state).m_sentReset = false;
    (this->m_state).m_receivedReset = false;
    this_02 = FieldMap::getFieldRef(&this_00->super_FieldMap,0x22);
    uVar3 = UInt64Field::getValue((UInt64Field *)this_02);
    SVar4 = SessionState::getNextTargetMsgSeqNum(this_01);
    if ((uVar3 <= SVar4) || (bVar1 = BoolField::getValue((BoolField *)&local_88), bVar1)) {
      SessionState::incrNextTargetMsgSeqNum(this_01);
      do {
        SVar4 = SessionState::getNextTargetMsgSeqNum(this_01);
        bVar1 = nextQueued(this,SVar4,now);
      } while (bVar1);
    }
    else if (this->m_sendNextExpectedMsgSeqNum == true) {
      pIVar6 = (IntTConvertor<unsigned_long> *)SessionState::getNextTargetMsgSeqNum(this_01);
      IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_288,pIVar6,value_00);
      std::operator+(&local_2a8,"Expecting retransmits FROM: ",&local_288);
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a8);
      paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar11) {
        local_2f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2f0.field_2._8_8_ = plVar7[3];
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
      }
      else {
        local_2f0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_2f0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_2f0._M_string_length = plVar7[1];
      *plVar7 = (long)paVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      uVar3 = UInt64Field::getValue((UInt64Field *)this_02);
      IntTConvertor<unsigned_long>::convert_abi_cxx11_
                (&local_2c8,(IntTConvertor<unsigned_long> *)(uVar3 - 1),value_01);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_268,
                     &local_2f0,&local_2c8);
      SessionState::onEvent(this_01,(string *)local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._0_8_ != local_258) {
        operator_delete((void *)local_268._0_8_,local_258[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != &local_2f0.field_2) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      uVar3 = UInt64Field::getValue((UInt64Field *)this_02);
      SessionState::queue(this_01,uVar3,logon);
      SVar4 = SessionState::getNextTargetMsgSeqNum(this_01);
      uVar3 = UInt64Field::getValue((UInt64Field *)this_02);
      (this->m_state).m_resendRange.first = SVar4;
      (this->m_state).m_resendRange.second = uVar3 - 1;
    }
    else {
      doTargetTooHigh(this,logon);
    }
    if (((this->m_state).m_receivedLogon == true) && (((this->m_state).m_sentLogon & 1U) != 0)) {
      (**(code **)(*(long *)this->m_application + 0x18))(this->m_application,&this->m_sessionID);
    }
    if ((char)local_2d0 != '\0') {
      local_2d0 = (pthread_mutex_t *)&this->m_mutex;
      Mutex::lock((Mutex *)&local_2d0->__data);
      pIVar6 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue((UInt64Field *)&local_e0);
      SVar4 = SessionState::getNextSenderMsgSeqNum(this_01);
      IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_288,pIVar6,value);
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_288,0,(char *)0x0,0x1cddb2);
      local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
      psVar10 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar10) {
        local_2a8.field_2._M_allocated_capacity = *psVar10;
        local_2a8.field_2._8_8_ = plVar7[3];
      }
      else {
        local_2a8.field_2._M_allocated_capacity = *psVar10;
        local_2a8._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_2a8._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_2a8);
      paVar11 = &local_2f0.field_2;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 == paVar12) {
        local_2f0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2f0.field_2._8_8_ = plVar7[3];
        local_2f0._M_dataplus._M_p = (pointer)paVar11;
      }
      else {
        local_2f0.field_2._M_allocated_capacity = paVar12->_M_allocated_capacity;
        local_2f0._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_2f0._M_string_length = plVar7[1];
      *plVar7 = (long)paVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      IntTConvertor<unsigned_long>::convert_abi_cxx11_
                (&local_2c8,(IntTConvertor<unsigned_long> *)(SVar4 - 1),local_2f0._M_string_length);
      uVar9 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != paVar11) {
        uVar9 = local_2f0.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar9 < local_2c8._M_string_length + local_2f0._M_string_length) {
        uVar9 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
          uVar9 = local_2c8.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar9 < local_2c8._M_string_length + local_2f0._M_string_length)
        goto LAB_001a4e32;
        puVar8 = (undefined8 *)
                 std::__cxx11::string::replace
                           ((ulong)&local_2c8,0,(char *)0x0,(ulong)local_2f0._M_dataplus._M_p);
      }
      else {
LAB_001a4e32:
        puVar8 = (undefined8 *)
                 std::__cxx11::string::_M_append
                           ((char *)&local_2f0,(ulong)local_2c8._M_dataplus._M_p);
      }
      local_268._0_8_ = local_258;
      paVar12 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(puVar8 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar8 == paVar12) {
        local_258[0]._0_8_ = paVar12->_M_allocated_capacity;
        local_258[0]._8_8_ = puVar8[3];
      }
      else {
        local_258[0]._0_8_ = paVar12->_M_allocated_capacity;
        local_268._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*puVar8;
      }
      local_268._8_8_ = puVar8[1];
      *puVar8 = paVar12;
      puVar8[1] = 0;
      paVar12->_M_local_buf[0] = '\0';
      SessionState::onEvent(this_01,(string *)local_268);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_268._0_8_ != local_258) {
        operator_delete((void *)local_268._0_8_,local_258[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
        operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._M_dataplus._M_p != paVar11) {
        operator_delete(local_2f0._M_dataplus._M_p,local_2f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if (this->m_persistMessages == false) {
        UInt64Field::UInt64Field((UInt64Field *)local_268,0x10,SVar4);
        local_268._0_8_ = &PTR__FieldBase_001f6f78;
        uVar3 = UInt64Field::getValue((UInt64Field *)local_268);
        FieldBase::~FieldBase((FieldBase *)local_268);
        SVar4 = SessionState::getNextSenderMsgSeqNum(this_01);
        if (SVar4 < uVar3) {
          UInt64Field::UInt64Field((UInt64Field *)local_268,0x10,SVar4);
          local_268._0_8_ = &PTR__FieldBase_001f6f78;
          uVar3 = UInt64Field::getValue((UInt64Field *)local_268);
          FieldBase::~FieldBase((FieldBase *)local_268);
        }
        generateSequenceReset(this,(SEQNUM)pIVar6,uVar3);
      }
      else {
        generateRetransmits(this,(SEQNUM)pIVar6,SVar4 - 1);
      }
      iVar2 = (this->m_mutex).m_count;
      (this->m_mutex).m_count = iVar2 + -1;
      if (iVar2 < 2) {
        (this->m_mutex).m_threadID = 0;
        pthread_mutex_unlock(local_2d0);
      }
    }
  }
  FieldBase::~FieldBase(&local_e0);
LAB_001a5031:
  FieldBase::~FieldBase(&local_88);
  return;
}

Assistant:

void Session::nextLogon(const Message &logon, const UtcTimeStamp &now) {
  logon.getHeader().getField<SenderCompID>();
  logon.getHeader().getField<TargetCompID>();

  if (m_refreshOnLogon) {
    refresh();
  }

  if (!isEnabled()) {
    m_state.onEvent("Session is not enabled for logon");
    disconnect();
    return;
  }

  if (!isLogonTime(now)) {
    m_state.onEvent("Received logon outside of valid logon time");
    disconnect();
    return;
  }

  ResetSeqNumFlag resetSeqNumFlag(false);
  logon.getFieldIfSet(resetSeqNumFlag);
  m_state.receivedReset(resetSeqNumFlag);

  if (m_state.receivedReset()) {
    m_state.onEvent("Logon contains ResetSeqNumFlag=Y, reseting sequence numbers to 1");
    if (!m_state.sentReset()) {
      m_state.reset(m_timestamper());
    }
  }

  if (m_state.shouldSendLogon() && !m_state.receivedReset()) {
    m_state.onEvent("Received logon response before sending request");
    disconnect();
    return;
  }

  if (!m_state.initiate() && m_resetOnLogon) {
    m_state.reset(m_timestamper());
  }

  if (!verify(logon, false, true)) {
    return;
  }
  m_state.receivedLogon(true);

  bool sendRetransmitsAfterLogon = false;
  NextExpectedMsgSeqNum nextExpectedMsgSeqNum;
  if (logon.getFieldIfSet(nextExpectedMsgSeqNum)) {
    if (nextExpectedMsgSeqNum.getValue() < getExpectedSenderNum()) {
      sendRetransmitsAfterLogon = true;
    } else if (nextExpectedMsgSeqNum.getValue() > getExpectedSenderNum()) {
      std::stringstream stream;
      stream << "NextExpectedMsgSeqNum too high, expecting " << getExpectedSenderNum() << " but received "
             << nextExpectedMsgSeqNum;
      m_state.onEvent(stream.str());
      generateLogout(stream.str());
      disconnect();
      return;
    }
  }

  if (!m_state.initiate() || (m_state.receivedReset() && !m_state.sentReset())) {
    logon.getFieldIfSet(m_state.heartBtInt());
    m_state.onEvent("Received logon request");
    generateLogon(logon);
    m_state.onEvent("Responding to logon request");
  } else {
    m_state.onEvent("Received logon response");
  }

  m_state.sentReset(false);
  m_state.receivedReset(false);

  auto const &msgSeqNum = logon.getHeader().getField<MsgSeqNum>();
  if (isTargetTooHigh(msgSeqNum) && !resetSeqNumFlag) {
    if (m_sendNextExpectedMsgSeqNum) {
      m_state.onEvent(
          "Expecting retransmits FROM: " + SEQNUM_CONVERTOR::convert(getExpectedTargetNum())
          + " TO: " + SEQNUM_CONVERTOR::convert(msgSeqNum - 1));
      m_state.queue(msgSeqNum, logon);
      m_state.resendRange(getExpectedTargetNum(), msgSeqNum - 1);
    } else {
      doTargetTooHigh(logon);
    }
  } else {
    m_state.incrNextTargetMsgSeqNum();
    nextQueued(now);
  }

  if (isLoggedOn()) {
    m_application.onLogon(m_sessionID);
  }

  if (sendRetransmitsAfterLogon) {
    Locker l(m_mutex);

    auto beginSeqNo = nextExpectedMsgSeqNum.getValue();
    auto endSeqNo = getExpectedSenderNum() - 1;
    m_state.onEvent(
        "Sending retransmits due to received NextExpectedMsgSeqNum is too low. FROM: "
        + SEQNUM_CONVERTOR::convert(beginSeqNo) + " TO: " + SEQNUM_CONVERTOR::convert(endSeqNo));

    if (!m_persistMessages) {
      endSeqNo = EndSeqNo(endSeqNo + 1);
      auto next = m_state.getNextSenderMsgSeqNum();
      if (endSeqNo > next) {
        endSeqNo = EndSeqNo(next);
      }
      generateSequenceReset(beginSeqNo, endSeqNo);
    } else {
      generateRetransmits(beginSeqNo, endSeqNo);
    }
  }
}